

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

telnet_t *
telnet_init(telnet_telopt_t *telopts,telnet_event_handler_t eh,uchar flags,void *user_data)

{
  telnet_t *ptVar1;
  
  ptVar1 = (telnet_t *)calloc(1,0x48);
  if (ptVar1 == (telnet_t *)0x0) {
    ptVar1 = (telnet_t *)0x0;
  }
  else {
    ptVar1->ud = user_data;
    ptVar1->telopts = telopts;
    ptVar1->eh = eh;
    ptVar1->flags = flags;
  }
  return ptVar1;
}

Assistant:

telnet_t *telnet_init(const telnet_telopt_t *telopts,
		telnet_event_handler_t eh, unsigned char flags, void *user_data) {
	/* allocate structure */
	struct telnet_t *telnet = (telnet_t*)calloc(1, sizeof(telnet_t));
	if (telnet == 0)
		return 0;

	/* initialize data */
	telnet->ud = user_data;
	telnet->telopts = telopts;
	telnet->eh = eh;
	telnet->flags = flags;

	return telnet;
}